

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O1

size_t __thiscall
CCharmapToLocalSB::map
          (CCharmapToLocalSB *this,wchar_t unicode_char,char **output_ptr,size_t *output_len)

{
  uint *puVar1;
  uchar *puVar2;
  ulong uVar3;
  size_t sVar4;
  ulong __n;
  
  puVar1 = (this->super_CCharmapToLocal).map_[(ulong)((uint)unicode_char >> 8) & 0xff];
  if (puVar1 == (uint *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)puVar1[(ulong)(uint)unicode_char & 0xff];
  }
  puVar2 = (this->super_CCharmapToLocal).xlat_array_;
  __n = (ulong)puVar2[uVar3];
  if (*output_len < __n) {
    sVar4 = 0;
  }
  else {
    memcpy(*output_ptr,puVar2 + uVar3 + 1,__n);
    *output_ptr = *output_ptr + __n;
    sVar4 = *output_len - __n;
  }
  *output_len = sVar4;
  return __n;
}

Assistant:

size_t CCharmapToLocalSB::map(wchar_t unicode_char, char **output_ptr,
                              size_t *output_len) const
{
    /* get the mapping */
    size_t map_len;
    const unsigned char *mapping = get_xlation(unicode_char, &map_len);
    
    /* if we don't have room for one more character, abort */
    if (*output_len < map_len)
    {
        *output_len = 0;
        return map_len;
    }
    
    /* copy the mapping */
    memcpy(*output_ptr, mapping, map_len);
    
    /* increment the pointer by the number of characters we copied */
    *output_ptr += map_len;

    /* adjust the remaining output length */
    *output_len -= map_len;
    
    /* return the size of the result */
    return map_len;
}